

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::XmlReporter::subcase_start(XmlReporter *this,SubcaseSignature *in)

{
  XmlWriter *pXVar1;
  char *attribute;
  uint local_c8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  SubcaseSignature *local_18;
  SubcaseSignature *in_local;
  XmlReporter *this_local;
  
  local_18 = in;
  in_local = (SubcaseSignature *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"SubCase",&local_39);
  pXVar1 = XmlWriter::startElement(&this->xml,&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"name",&local_71);
  pXVar1 = XmlWriter::writeAttribute<doctest::String>(pXVar1,&local_70,&local_18->m_name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"filename",&local_99);
  attribute = skipPathFromFilename(local_18->m_file);
  pXVar1 = XmlWriter::writeAttribute(pXVar1,&local_98,attribute);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"line",&local_c1);
  local_c8 = line(this,local_18->m_line);
  XmlWriter::writeAttribute<unsigned_int>(pXVar1,&local_c0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  XmlWriter::ensureTagClosed(&this->xml);
  return;
}

Assistant:

void subcase_start(const SubcaseSignature& in) override {
            xml.startElement("SubCase")
                    .writeAttribute("name", in.m_name)
                    .writeAttribute("filename", skipPathFromFilename(in.m_file))
                    .writeAttribute("line", line(in.m_line));
            xml.ensureTagClosed();
        }